

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  pointer this;
  ulong uVar2;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  smatch smatch;
  string vm_file_name;
  string exe_rel_path;
  string rel_path;
  regex regexp;
  VM_Writer vm_writer;
  ofstream out_file;
  ofstream vm_file;
  Tokenizer tokenizer;
  Parser parser;
  ifstream file;
  
  std::ifstream::ifstream(&file);
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exe_rel_path,*argv,(allocator<char> *)&vm_file);
    Tokenizer::Tokenizer(&tokenizer,&file);
    for (uVar2 = 1; (uint)argc != uVar2; uVar2 = uVar2 + 1) {
      std::__cxx11::string::substr((ulong)&out_file,(ulong)&exe_rel_path);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vm_file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                     argv[uVar2]);
      std::__cxx11::string::~string((string *)&out_file);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                     "Compiling file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vm_file);
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&out_file);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&out_file);
      std::ifstream::open((string *)&file,
                          (_Ios_Openmode)
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &vm_file);
      Tokenizer::get_tokens(&tokenizer);
      std::ios::clear((int)*(undefined8 *)(_file + -0x18) + (int)(string *)&file);
      std::__cxx11::string::~string((string *)&vm_file);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&regexp,"[A-Z]*[a-z]*.jack",0x10);
    smatch.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    smatch._M_begin._M_current = (char *)0x0;
    smatch.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    smatch.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rel_path,argv[1],(allocator<char> *)&vm_file);
    std::
    regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
              (&rel_path,&smatch,&regexp,0);
    vm_file_name._M_dataplus._M_p = (pointer)&vm_file_name.field_2;
    vm_file_name._M_string_length = 0;
    vm_file_name.field_2._M_local_buf[0] = '\0';
    psVar3 = smatch.
             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
    if (smatch.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        smatch.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar3 = smatch.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (this = smatch.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != psVar3; this = this + 1) {
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((string_type *)&vm_file,this);
      std::__cxx11::string::substr((ulong)&parser,(ulong)&vm_file);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                     "vm");
      std::__cxx11::string::operator=((string *)&vm_file_name,(string *)&out_file);
      std::__cxx11::string::~string((string *)&out_file);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::~string((string *)&vm_file);
    }
    std::ofstream::ofstream(&vm_file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                   "/home/mke/projects/c++/jack_compiler/compiler/",&vm_file_name);
    std::ofstream::open((string *)&vm_file,(_Ios_Openmode)&out_file);
    std::__cxx11::string::~string((string *)&out_file);
    VM_Writer::VM_Writer(&vm_writer,&vm_file);
    std::ofstream::ofstream(&out_file);
    std::ofstream::open((char *)&out_file,0x13817f);
    Parser::Parser(&parser,&out_file,&tokenizer,&vm_writer);
    std::ifstream::close();
    std::ofstream::close();
    Parser::~Parser(&parser);
    std::ofstream::~ofstream(&out_file);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vm_writer.op_map._M_t);
    std::ofstream::~ofstream(&vm_file);
    std::__cxx11::string::~string((string *)&vm_file_name);
    std::__cxx11::string::~string((string *)&rel_path);
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&smatch);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regexp);
    Tokenizer::~Tokenizer(&tokenizer);
    std::__cxx11::string::~string((string *)&exe_rel_path);
    std::ifstream::~ifstream(&file);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: jcomp <your_file.jack> (<your_file.jack>)*"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(0);
}

Assistant:

int main(int argc, char** argv) {

    std::ifstream file;

    if (argc < 2) {
        std::cerr << "Usage: jcomp <your_file.jack> (<your_file.jack>)*" << std::endl;
        exit(0);
    }

    std::string exe_rel_path = argv[0];
    Tokenizer tokenizer(file);


    for (int i = 1; i < argc; i++) {
        std::string file_path =  exe_rel_path.substr(0, exe_rel_path.length() - 5) + argv[i];
        std::cout << "Compiling file: " + file_path << std::endl;
        file.open(file_path, std::ifstream::in);
        tokenizer.get_tokens();
        file.clear();
    }

    std::regex regexp("[A-Z]*[a-z]*.jack");
    std::smatch smatch;
    std::string rel_path = argv[1];
    std::regex_search(rel_path, smatch, regexp);

    std::string vm_file_name;
    for (std::string str : smatch) {
        vm_file_name = str.substr(0, str.size() - 4) + "vm";
    }

    std::ofstream vm_file;
    vm_file.open("/home/mke/projects/c++/jack_compiler/compiler/" + vm_file_name);
    VM_Writer vm_writer(vm_file);

    std::ofstream out_file;
    out_file.open("/home/mke/projects/c++/jack_compiler/compiler/syntax_struct.xml");

    Parser parser(out_file, tokenizer, vm_writer);

    file.close();
    out_file.close();

    return 0;
}